

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleBot.h
# Opt level: O3

void __thiscall ExampleBot::ExampleBot(ExampleBot *this,string *name)

{
  pointer pcVar1;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR_nextRound_0010eb00;
  (this->super_Player).m_name._M_dataplus._M_p = (pointer)&(this->super_Player).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Player).m_name,local_38,local_38 + local_30);
  (this->super_Player).m_cards.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Player).m_cards.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Player).m_cards.super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->super_Player)._vptr_Player = (_func_int **)&PTR_nextRound_0010ed78;
  return;
}

Assistant:

ExampleBot(std::string name = "noName") : Player(name) {}